

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_ASAi_dns_constraints.c
# Opt level: O0

int fQB(sunrealtype t,N_Vector y,N_Vector yB,N_Vector qBdot,void *user_dataB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  sunrealtype y23;
  sunrealtype l32;
  sunrealtype l21;
  sunrealtype l3;
  sunrealtype l2;
  sunrealtype l1;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  void *user_dataB_local;
  N_Vector qBdot_local;
  N_Vector yB_local;
  N_Vector y_local;
  sunrealtype t_local;
  
  dVar1 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  dVar2 = *(double *)(*(long *)((long)y->content + 0x10) + 0x10);
  dVar3 = *(double *)(*(long *)((long)yB->content + 0x10) + 8);
  dVar4 = *(double *)(*(long *)((long)yB->content + 0x10) + 0x10);
  dVar5 = dVar3 - **(double **)((long)yB->content + 0x10);
  **(double **)((long)qBdot->content + 0x10) = **(double **)((long)y->content + 0x10) * dVar5;
  *(double *)(*(long *)((long)qBdot->content + 0x10) + 8) = -(dVar1 * dVar2) * dVar5;
  *(double *)(*(long *)((long)qBdot->content + 0x10) + 0x10) = dVar1 * dVar1 * (dVar4 - dVar3);
  return 0;
}

Assistant:

static int fQB(sunrealtype t, N_Vector y, N_Vector yB, N_Vector qBdot,
               void* user_dataB)
{
  sunrealtype y1, y2, y3;
  sunrealtype l1, l2, l3;
  sunrealtype l21, l32, y23;

  /* The y vector */
  y1 = Ith(y, 1);
  y2 = Ith(y, 2);
  y3 = Ith(y, 3);

  /* The lambda vector */
  l1 = Ith(yB, 1);
  l2 = Ith(yB, 2);
  l3 = Ith(yB, 3);

  /* Temporary variables */
  l21 = l2 - l1;
  l32 = l3 - l2;
  y23 = y2 * y3;

  Ith(qBdot, 1) = y1 * l21;
  Ith(qBdot, 2) = -y23 * l21;
  Ith(qBdot, 3) = y2 * y2 * l32;

  return (0);
}